

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::OnImportTable
          (BinaryReaderObjdump *this,Index import_index,string_view module_name,
          string_view field_name,Index table_index,Type elem_type,Limits *elem_limits)

{
  char *pcVar1;
  
  pcVar1 = Type::GetName(&elem_type);
  PrintDetails(this," - table[%u] type=%s initial=%ld",(ulong)table_index,pcVar1,
               elem_limits->initial);
  if (elem_limits->has_max == true) {
    PrintDetails(this," max=%ld",elem_limits->max);
  }
  PrintDetails(this," <- %.*s.%.*s\n",module_name.size_ & 0xffffffff,module_name.data_,
               field_name.size_ & 0xffffffff,field_name.data_);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnImportTable(Index import_index,
                                          string_view module_name,
                                          string_view field_name,
                                          Index table_index,
                                          Type elem_type,
                                          const Limits* elem_limits) {
  PrintDetails(" - table[%" PRIindex "] type=%s initial=%" PRId64, table_index,
               elem_type.GetName(), elem_limits->initial);
  if (elem_limits->has_max) {
    PrintDetails(" max=%" PRId64, elem_limits->max);
  }
  PrintDetails(" <- " PRIstringview "." PRIstringview "\n",
               WABT_PRINTF_STRING_VIEW_ARG(module_name),
               WABT_PRINTF_STRING_VIEW_ARG(field_name));
  return Result::Ok;
}